

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BppTree.h
# Opt level: O0

void __thiscall
BppTree<int,_int>::BppTree(BppTree<int,_int> *this,ion_dictionary_config_info_t config)

{
  int __oflag;
  char *in_RSI;
  BppTree<int,_int> *this_local;
  
  bpptree_init((ion_dictionary_handler_t *)this);
  Dictionary<int,_int>::open(&this->super_Dictionary<int,_int>,in_RSI,__oflag);
  return;
}

Assistant:

BppTree(
	ion_dictionary_config_info_t config
) {
	bpptree_init(&this->handler);

	this->open(config);
}